

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkedAllocator.c
# Opt level: O1

void sysbvm_chunkedAllocator_destroy(sysbvm_chunkedAllocator_t *allocator)

{
  sysbvm_chunkedAllocatorChunk_s **ppsVar1;
  sysbvm_chunkedAllocatorChunk_s *psVar2;
  sysbvm_chunkedAllocatorChunk_t *psVar3;
  size_t sizeToFree;
  
  psVar3 = allocator->firstChunk;
joined_r0x0015686e:
  do {
    if (psVar3 == (sysbvm_chunkedAllocatorChunk_t *)0x0) {
      return;
    }
    psVar2 = psVar3->next;
    sizeToFree = psVar3->capacity + 0x40;
    if (allocator->requiresExecutableMapping == true) {
      if (psVar3->writeableMapping != psVar3->executableMapping) {
        sysbvm_virtualMemory_freeSystemMemoryWithDualMapping
                  (sizeToFree,psVar3->dualMappingHandle,psVar3->writeableMapping,
                   psVar3->executableMapping);
        psVar3 = psVar2;
        goto joined_r0x0015686e;
      }
    }
    ppsVar1 = &psVar3->writeableMapping;
    psVar3 = psVar2;
    if (*ppsVar1 != (sysbvm_chunkedAllocatorChunk_s *)0x0) {
      sysbvm_virtualMemory_freeSystemMemory(*ppsVar1,sizeToFree);
    }
  } while( true );
}

Assistant:

SYSBVM_API void sysbvm_chunkedAllocator_destroy(sysbvm_chunkedAllocator_t *allocator)
{
    sysbvm_chunkedAllocatorChunk_t *chunk = allocator->firstChunk;
    while(chunk)
    {
        sysbvm_chunkedAllocatorChunk_t *nextChunk = chunk->next;
        size_t fullChunkSize = sizeof(sysbvm_chunkedAllocatorChunk_t) + chunk->capacity;

        if(allocator->requiresExecutableMapping && chunk->writeableMapping != chunk->executableMapping)
        {
            sysbvm_chunkedAllocatorChunk_t *writeableMapping = chunk->writeableMapping;
            sysbvm_chunkedAllocatorChunk_t *executableMapping = chunk->executableMapping;
            sysbvm_virtualMemory_freeSystemMemoryWithDualMapping(fullChunkSize, chunk->dualMappingHandle, writeableMapping, executableMapping);
            chunk = nextChunk;

        }
        else
        {
            sysbvm_chunkedAllocatorChunk_t *writeableMapping = chunk->writeableMapping;
            if(writeableMapping)
                sysbvm_virtualMemory_freeSystemMemory(writeableMapping, fullChunkSize);
        }

        chunk = nextChunk;
    }
}